

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool __thiscall UI::renderList(UI *this,char *label,int width,bool active)

{
  bool bVar1;
  bool bVar2;
  byte in_CL;
  int in_EDX;
  undefined8 in_RSI;
  ImVec2 col;
  ImVec2 p0;
  bool result;
  int npop;
  ImVec2 *in_stack_ffffffffffffffb8;
  ImVec2 *in_stack_ffffffffffffffc0;
  char *pcVar3;
  ImVec2 in_stack_ffffffffffffffd0;
  ImGuiCol idx;
  
  idx = 0;
  ImGui::PushID((char *)in_stack_ffffffffffffffd0);
  col = ImGui::GetCursorScreenPos();
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd0,(float)in_EDX,1.0);
  bVar1 = ImGui::Button((char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  bVar2 = ImGui::IsItemHovered((ImGuiHoveredFlags)in_stack_ffffffffffffffc0);
  if ((bVar2) || ((in_CL & 1) != 0)) {
    ImGui::PushStyleColor(idx,(ImVec4 *)col);
  }
  ImGui::SetCursorScreenPos(in_stack_ffffffffffffffc0);
  if ((in_CL & 1) == 0) {
    pcVar3 = ">";
  }
  else {
    pcVar3 = "v";
  }
  ImGui::Text("%s %s",pcVar3,in_RSI);
  ImGui::PopStyleColor((int)((ulong)pcVar3 >> 0x20));
  ImGui::PopID();
  return bVar1;
}

Assistant:

bool UI::renderList(const char * label, int width, bool active) {
    int npop = 0;
    bool result = false;

    ImGui::PushID(label);
    const auto p0 = ImGui::GetCursorScreenPos();
    if (ImGui::Button("##but", ImVec2(width, 1))) {
        result = true;
    }
    if (ImGui::IsItemHovered() || active) {
        ImGui::PushStyleColor(ImGuiCol_Text, colors.listHeaderFG);
        ++npop;
    }
    ImGui::SetCursorScreenPos(p0);
    ImGui::Text("%s %s", active ? "v" : ">", label);
    ImGui::PopStyleColor(npop);
    ImGui::PopID();

    return result;
}